

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O2

void __thiscall
dlib::
sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
::add(sequence_kernel_2<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>,_dlib::memory_manager_stateless_kernel_1<char>_>
      *this,unsigned_long pos,
     unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_> *item)

{
  tuple<dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_> tVar1;
  unsigned_long size;
  node *pnVar2;
  node *pnVar3;
  node *pnVar4;
  
  pnVar4 = (node *)operator_new(0x18);
  tVar1.super__Tuple_impl<0UL,_dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_>.
  super__Head_base<0UL,_dlib::toggle_button_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_>)
       (item->_M_t).
       super___uniq_ptr_impl<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>._M_t.
       super__Tuple_impl<0UL,_dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_>.
       super__Head_base<0UL,_dlib::toggle_button_*,_false>._M_head_impl;
  (item->_M_t).super___uniq_ptr_impl<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>
  ._M_t.super__Tuple_impl<0UL,_dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_>.
  super__Head_base<0UL,_dlib::toggle_button_*,_false>._M_head_impl = (toggle_button *)0x0;
  (pnVar4->item)._M_t.
  super___uniq_ptr_impl<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>._M_t.
  super__Tuple_impl<0UL,_dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_> =
       tVar1.
       super__Tuple_impl<0UL,_dlib::toggle_button_*,_std::default_delete<dlib::toggle_button>_>.
       super__Head_base<0UL,_dlib::toggle_button_*,_false>._M_head_impl;
  size = this->sequence_size;
  if (size == 0) {
    this->current_pos = 0;
    pnVar4->left = pnVar4;
    pnVar4->right = pnVar4;
  }
  else if (size == pos) {
    move_to_pos(this,&this->current_node,&this->current_pos,pos - 1,pos);
    pnVar2 = this->current_node;
    pnVar3 = pnVar2->right;
    pnVar4->right = pnVar3;
    pnVar4->left = pnVar2;
    pnVar3->left = pnVar4;
    pnVar2->right = pnVar4;
    this->current_pos = pos;
  }
  else {
    move_to_pos(this,&this->current_node,&this->current_pos,pos,size);
    pnVar2 = this->current_node;
    pnVar4->right = pnVar2;
    pnVar3 = pnVar2->left;
    pnVar4->left = pnVar3;
    pnVar3->right = pnVar4;
    pnVar2->left = pnVar4;
  }
  this->current_node = pnVar4;
  this->sequence_size = this->sequence_size + 1;
  (*(this->
    super_enumerable<std::unique_ptr<dlib::toggle_button,_std::default_delete<dlib::toggle_button>_>_>
    )._vptr_enumerable[3])(this);
  return;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    add (
        unsigned long pos,
        T& item
    )
    {
        // make new node and swap item into it
        node* new_node = new node;
        exchange(item,new_node->item);

        if (sequence_size > 0)
        {
            if (pos == sequence_size)
            {
                move_to_pos(current_node,current_pos,pos-1,sequence_size);
                
                node& n_node = *new_node;
                node& c_node = *current_node;

                // make new node point to the nodes to its left and right
                n_node.right = c_node.right;
                n_node.left  = current_node;

                // make the left node point back to new_node
                c_node.right->left = new_node;

                // make the right node point back to new_node
                c_node.right = new_node;
                current_pos = pos;

            }
            else
            {
                move_to_pos(current_node,current_pos,pos,sequence_size);

                node& n_node = *new_node;
                node& c_node = *current_node;

                // make new node point to the nodes to its left and right
                n_node.right = current_node;
                n_node.left  = c_node.left;

                // make the left node point back to new_node
                c_node.left->right = new_node;

                // make the right node point back to new_node
                c_node.left = new_node;
            }
            
        }
        else
        {
            current_pos = 0;
            new_node->left = new_node;
            new_node->right = new_node;
        }

        // make the new node the current node
        current_node = new_node;    
    
        ++sequence_size;
        // reset the enumerator
        reset();
    }